

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_b_tree.cpp
# Opt level: O3

void __thiscall test_b_tree::test_remove_random_order(test_b_tree *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__filename;
  undefined8 uVar2;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __first;
  runtime_error *prVar3;
  value_type_conflict1 *__val;
  long lVar4;
  long *plVar5;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __last;
  long lVar6;
  long lVar7;
  optional<long> oVar8;
  vector<long,_std::allocator<long>_> keys;
  b_tree t;
  undefined1 local_b8 [16];
  pointer local_a8;
  string local_a0;
  b_tree local_80;
  
  paVar1 = &local_80._p._fileName.field_2;
  local_80._p._fileName._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"test_remove_random_order.db","");
  b_tree::create_db_file((string *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._p._fileName._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._p._fileName._M_dataplus._M_p,
                    local_80._p._fileName.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"test_remove_random_order.db","");
  b_tree::b_tree(&local_80,&local_a0,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_b8 = (undefined1  [16])0x0;
  local_a8 = (pointer)0x0;
  __first._M_current = (long *)operator_new(800);
  local_b8._0_8_ = __first._M_current;
  __last._M_current = __first._M_current + 100;
  lVar4 = 0;
  local_a8 = __last._M_current;
  memset(__first._M_current,0,800);
  lVar6 = 1;
  lVar7 = 2;
  do {
    __first._M_current[lVar4] = lVar6;
    (__first._M_current + lVar4)[1] = lVar7;
    lVar4 = lVar4 + 2;
    lVar6 = lVar6 + 2;
    lVar7 = lVar7 + 2;
  } while (lVar4 != 100);
  local_a0._M_dataplus._M_p = (pointer)0x1;
  local_b8._8_8_ = __last._M_current;
  std::
  shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            (__first,__last,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&local_a0);
  insert_all<b_tree>(&local_80,(vector<long,_std::allocator<long>_> *)local_b8);
  local_a0._M_dataplus._M_p = (pointer)0x1;
  std::
  shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)local_b8._0_8_,
             (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)local_b8._8_8_,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&local_a0);
  uVar2 = local_b8._8_8_;
  if (local_b8._0_8_ != local_b8._8_8_) {
    plVar5 = (long *)local_b8._0_8_;
    do {
      __filename = (char *)*plVar5;
      oVar8 = b_tree::search(&local_80,(int64_t)__filename);
      if (((undefined1  [16])
           oVar8.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        rtf_format_abi_cxx11_
                  (&local_a0,"%s at Line:%d File:%s","t.search(k)",0xb5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dicroce[P]tdb/ut/source/test_b_tree.cpp"
                  );
        std::runtime_error::runtime_error(prVar3,(string *)&local_a0);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      b_tree::remove(&local_80,__filename);
      oVar8 = b_tree::search(&local_80,(int64_t)__filename);
      if (((undefined1  [16])
           oVar8.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        rtf_format_abi_cxx11_
                  (&local_a0,"%s at Line:%d File:%s","!t.search(k)",0xb7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dicroce[P]tdb/ut/source/test_b_tree.cpp"
                  );
        std::runtime_error::runtime_error(prVar3,(string *)&local_a0);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      plVar5 = plVar5 + 1;
    } while (plVar5 != (long *)uVar2);
  }
  unlink("test_remove_random_order.db");
  if ((long *)local_b8._0_8_ != (long *)0x0) {
    operator_delete((void *)local_b8._0_8_,(long)local_a8 - local_b8._0_8_);
  }
  pager::~pager(&local_80._p);
  return;
}

Assistant:

void test_b_tree::test_large_number_of_keys()
{
    b_tree::create_db_file("test_large_number_of_keys.db");
    b_tree t("test_large_number_of_keys.db", 4);

    std::vector<int64_t> keys(10000);
    std::iota(begin(keys), end(keys), 1);
    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    insert_all(t, keys);

    RTF_ASSERT(has_all_keys(t, keys));

    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    for (auto k : keys) {
        t.remove(k);
    }

    for (auto k : keys) {
        RTF_ASSERT(!t.search(k));
    }

    unlink("test_large_number_of_keys.db");
}